

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

void * nullcGetGlobal(char *name)

{
  uint uVar1;
  void *pvVar2;
  ExternVarInfo *pEVar3;
  uint index;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    pvVar2 = nullcGetVariableData((uint *)0x0);
    if (((pvVar2 != (void *)0x0) && (name != (char *)0x0)) && (NULLC::linker != 0)) {
      uVar1 = NULLC::GetStringHash(name);
      for (index = 0; index < *(uint *)(NULLC::linker + 0x23c); index = index + 1) {
        pEVar3 = FastVector<ExternVarInfo,_false,_false>::operator[]
                           ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),index
                           );
        if (pEVar3->nameHash == uVar1) {
          pEVar3 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)(NULLC::linker + 0x230),
                              index);
          return (void *)((long)pvVar2 + (ulong)pEVar3->offset);
        }
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void* nullcGetGlobal(const char* name)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !mem)
		return NULL;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
			return mem + linker->exVariables[i].offset;
	}
	return NULL;
}